

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

ITracker * __thiscall
Catch::TestCaseTracking::ITracker::findChild(ITracker *this,NameAndLocationRef *nameAndLocation)

{
  bool bVar1;
  iterator __last;
  iterator __pred;
  pointer this_00;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  *in_RDI;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  it;
  vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
  *in_stack_ffffffffffffffb8;
  ITracker *pIVar2;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  in_stack_ffffffffffffffe8;
  
  __last = std::
           vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ::begin(in_stack_ffffffffffffffb8);
  __pred = std::
           vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ::end(in_stack_ffffffffffffffb8);
  std::
  find_if<__gnu_cxx::__normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>*,std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>>>,Catch::TestCaseTracking::ITracker::findChild(Catch::TestCaseTracking::NameAndLocationRef_const&)::__0>
            (in_stack_ffffffffffffffe8,
             (__normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
              )__last._M_current,(anon_class_8_1_9c565101_for__M_pred)__pred._M_current);
  std::
  vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::end(in_stack_ffffffffffffffb8);
  bVar1 = __gnu_cxx::operator!=
                    (in_RDI,(__normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
                             *)in_stack_ffffffffffffffb8);
  if (bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
              ::operator->((__normal_iterator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
                            *)&stack0xffffffffffffffe8);
    pIVar2 = Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::get(this_00);
  }
  else {
    pIVar2 = (ITracker *)0x0;
  }
  return pIVar2;
}

Assistant:

ITracker* ITracker::findChild( NameAndLocationRef const& nameAndLocation ) {
        auto it = std::find_if(
            m_children.begin(),
            m_children.end(),
            [&nameAndLocation]( ITrackerPtr const& tracker ) {
                auto const& tnameAndLoc = tracker->nameAndLocation();
                if ( tnameAndLoc.location.line !=
                     nameAndLocation.location.line ) {
                    return false;
                }
                return tnameAndLoc == nameAndLocation;
            } );
        return ( it != m_children.end() ) ? it->get() : nullptr;
    }